

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.hpp
# Opt level: O2

ssize_t __thiscall
websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
          (basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this,int __fd,
          void *__buf,size_t __n)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined4 extraout_var;
  
  std::mutex::lock(&this->m_lock);
  if ((this->m_dynamic_channels & __fd) != 0) {
    poVar2 = std::operator<<(this->m_out,"[");
    poVar2 = timestamp(poVar2);
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"[");
    pcVar3 = elevel::channel_name(__fd);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,(string *)__buf);
    std::operator<<(poVar2,"\n");
    std::ostream::flush();
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)this);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void write(level channel, std::string const & msg) {
        scoped_lock_type lock(m_lock);
        if (!this->dynamic_test(channel)) { return; }
        *m_out << "[" << timestamp << "] "
                  << "[" << names::channel_name(channel) << "] "
                  << msg << "\n";
        m_out->flush();
    }